

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_freeAttributes__set
          (ColladaParserAutoGen15Private *this,void *attributeData)

{
  StackMemoryManager *in_RSI;
  set__AttributeData *typedAttributeData;
  StackMemoryManager *this_00;
  
  this_00 = in_RSI;
  if (in_RSI[1].mActiveFrame != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(in_RSI);
  }
  if (in_RSI[0x12].mActiveFrame != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(this_00);
  }
  set__AttributeData::~set__AttributeData((set__AttributeData *)0xa26a03);
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_freeAttributes__set( void* attributeData )
{
    set__AttributeData* typedAttributeData = static_cast<set__AttributeData*>(attributeData);
    if (typedAttributeData->_class.data)
    {
        mStackMemoryManager.deleteObject();
    }

    if (typedAttributeData->unknownAttributes.data)
    {
        mStackMemoryManager.deleteObject();
    }


    typedAttributeData->~set__AttributeData();

    return true;
}